

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O3

cstr idx2::ToString(metadata *Meta)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  dtype dVar4;
  long lVar5;
  char *pcVar6;
  long *in_FS_OFFSET;
  printer Pr;
  printer local_30;
  
  pcVar6 = (char *)(*in_FS_OFFSET + -0x180);
  printer::printer(&local_30,pcVar6,0x180);
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar6 = "false && \"buffer too small\"";
LAB_0019c18d:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x24,"cstr idx2::ToString(const metadata &)");
    }
    iVar3 = snprintf(local_30.Buf,(long)local_30.Size,"name = %s\n",Meta);
    local_30.Buf = local_30.Buf + iVar3;
    iVar2 = local_30.Size - iVar3;
    bVar1 = local_30.Size < iVar3;
    local_30.Size = iVar2;
    if (iVar2 == 0 || bVar1) {
      pcVar6 = "false && \"buffer overflow?\"";
      goto LAB_0019c18d;
    }
  }
  else {
    if ((local_30.Buf != (char *)0x0) || ((FILE *)local_30.File == (FILE *)0x0)) {
      pcVar6 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_0019c18d;
    }
    fprintf((FILE *)local_30.File,"name = %s\n",Meta);
  }
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar6 = "false && \"buffer too small\"";
LAB_0019c1be:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x25,"cstr idx2::ToString(const metadata &)");
    }
    iVar2 = snprintf(local_30.Buf,(long)local_30.Size,"field = %s\n",Meta->Field);
    local_30.Buf = local_30.Buf + iVar2;
    iVar3 = local_30.Size - iVar2;
    if (local_30.Size - iVar2 == 0 || local_30.Size < iVar2) {
      pcVar6 = "false && \"buffer overflow?\"";
      goto LAB_0019c1be;
    }
  }
  else {
    if ((local_30.Buf != (char *)0x0) || ((FILE *)local_30.File == (FILE *)0x0)) {
      pcVar6 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_0019c1be;
    }
    fprintf((FILE *)local_30.File,"field = %s\n",Meta->Field);
    iVar3 = local_30.Size;
  }
  local_30.Size = iVar3;
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar6 = "false && \"buffer too small\"";
    }
    else {
      iVar2 = snprintf(local_30.Buf,(long)local_30.Size,"dimensions = %d %d %d\n",
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
      local_30.Buf = local_30.Buf + iVar2;
      iVar3 = local_30.Size - iVar2;
      if (local_30.Size - iVar2 != 0 && iVar2 <= local_30.Size) goto LAB_0019c08d;
      pcVar6 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((local_30.Buf == (char *)0x0) && ((FILE *)local_30.File != (FILE *)0x0)) {
      fprintf((FILE *)local_30.File,"dimensions = %d %d %d\n",
              (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
              (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
              (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
      iVar3 = local_30.Size;
LAB_0019c08d:
      local_30.Size = iVar3;
      dVar4 = Meta->DType;
      lVar5 = 0x10;
      do {
        if (*(dtype *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar5) == dVar4)
        goto LAB_0019c0b4;
        lVar5 = lVar5 + 0x18;
      } while (lVar5 != 0x100);
      dVar4 = __Invalid__;
LAB_0019c0b4:
      lVar5 = 0x10;
      while (*(dtype *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar5) != dVar4) {
        lVar5 = lVar5 + 0x18;
        if (lVar5 == 0x100) {
          __assert_fail("It != End(EnumS.NameMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataTypes.h"
                        ,10,"stref idx2::ToString(dtype)");
        }
      }
      if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
        if ((long)local_30.Size < 2) {
          pcVar6 = "false && \"buffer too small\"";
        }
        else {
          iVar3 = snprintf(local_30.Buf,(long)local_30.Size,"data type = %.*s");
          local_30.Buf = local_30.Buf + iVar3;
          if (iVar3 < local_30.Size) {
            return pcVar6;
          }
          pcVar6 = "false && \"buffer overflow?\"";
        }
      }
      else {
        if ((local_30.Buf == (char *)0x0) && ((FILE *)local_30.File != (FILE *)0x0)) {
          fprintf((FILE *)local_30.File,"data type = %.*s",
                  (ulong)*(uint *)(&bitstream::Masks + lVar5),
                  *(undefined8 *)(&bitstream::Masks.Len + lVar5));
          return pcVar6;
        }
        pcVar6 = "false && \"unavailable or ambiguous printer destination\"";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x28,"cstr idx2::ToString(const metadata &)");
    }
    pcVar6 = "false && \"unavailable or ambiguous printer destination\"";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                ,0x26,"cstr idx2::ToString(const metadata &)");
}

Assistant:

cstr
ToString(const metadata& Meta)
{
  printer Pr(Meta.String, sizeof(Meta.String));
  idx2_Print(&Pr, "name = %s\n", Meta.Name);
  idx2_Print(&Pr, "field = %s\n", Meta.Field);
  idx2_Print(&Pr, "dimensions = %d %d %d\n", Meta.Dims3.X, Meta.Dims3.Y, Meta.Dims3.Z);
  stref TypeStr = ToString(Meta.DType);
  idx2_Print(&Pr, "data type = %.*s", TypeStr.Size, TypeStr.Ptr);

  return Meta.String;
}